

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O2

bool __thiscall Linker::SaveRegVmListing(Linker *this,OutputContext *output,bool withProfileInfo)

{
  FastVector<ExternFuncInfo,_false,_false> *this_00;
  byte bVar1;
  uchar rA;
  uchar rB;
  uchar rC;
  float code;
  FastVector<unsigned_int,_false,_false> *pFVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  ExternFuncInfo *pEVar8;
  ulong uVar9;
  RegVmCmd *pRVar10;
  ExternFuncInfo **ppEVar11;
  char *pcVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  ulong uVar14;
  uint i_3;
  RegVmInstructionCode code_00;
  byte *pbVar15;
  OutputContext *this_01;
  ExternSourceInfo *pEVar16;
  byte *pbVar17;
  uint uVar18;
  uint i;
  uint uVar19;
  byte *pbVar20;
  ExternFuncInfo *local_398;
  float local_38c;
  OutputContext *local_388;
  uint local_37c;
  Linker *local_378;
  undefined4 local_36c;
  double local_368;
  FastVector<RegVmCmd,_false,_false> *local_360;
  uint local_354;
  ulong local_350;
  byte *local_348;
  FastVector<unsigned_int,_false,_false> *local_340;
  ExternSourceInfo *local_338;
  ulong local_330;
  FastVector<ExternFuncInfo,_false,_false> *local_328;
  FastVector<ExternTypeInfo,_false,_false> *local_320;
  ExternSourceInfo *local_318;
  ulong local_310;
  double local_308;
  double dStack_300;
  TraceScope traceScope;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> regVmJumpTargetSet;
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> regVmFunctionMap;
  
  local_388 = output;
  local_378 = this;
  if ((SaveRegVmListing(OutputContext&,bool)::token == '\0') &&
     (iVar6 = __cxa_guard_acquire(&SaveRegVmListing(OutputContext&,bool)::token), iVar6 != 0)) {
    SaveRegVmListing::token = NULLC::TraceGetToken("link","SaveRegVmListing");
    __cxa_guard_release(&SaveRegVmListing(OutputContext&,bool)::token);
    this = local_378;
  }
  NULLC::TraceScope::TraceScope(&traceScope,SaveRegVmListing::token);
  uVar19 = 0;
  if (withProfileInfo) {
    uVar14 = 0;
    for (; uVar19 != 0x100; uVar19 = uVar19 + 1) {
      puVar7 = FixedArray<unsigned_int,_256U>::operator[](&this->exRegVmInstructionExecCount,uVar19)
      ;
      uVar14 = uVar14 + *puVar7;
    }
  }
  else {
    uVar14 = 0;
  }
  local_338 = (this->exRegVmSourceInfo).data;
  local_330 = (ulong)(this->exRegVmSourceInfo).count;
  local_350 = uVar14;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::SmallDenseSet
            (&regVmJumpTargetSet,(Allocator *)0x0);
  for (uVar19 = 0; uVar19 < (this->regVmJumpTargets).count; uVar19 = uVar19 + 1) {
    puVar7 = FastVector<unsigned_int,_false,_false>::operator[](&this->regVmJumpTargets,uVar19);
    SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
              (&regVmJumpTargetSet,puVar7);
  }
  local_36c = (undefined4)CONCAT71(in_register_00000011,withProfileInfo);
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::SmallDenseMap
            (&regVmFunctionMap,(Allocator *)0x0);
  this_00 = &this->exFunctions;
  local_328 = this_00;
  for (uVar19 = 0; uVar19 < (this->exFunctions).count; uVar19 = uVar19 + 1) {
    pEVar8 = FastVector<ExternFuncInfo,_false,_false>::operator[](this_00,uVar19);
    local_354 = pEVar8->regVmAddress;
    local_398 = FastVector<ExternFuncInfo,_false,_false>::operator[](this_00,uVar19);
    SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::insert
              (&regVmFunctionMap,&local_354,&local_398);
  }
  pbVar17 = (byte *)(this->exSource).data;
  local_360 = &this->exRegVmCode;
  uVar18 = (int)local_330 - 1;
  local_340 = &this->exRegVmExecCount;
  dStack_300 = (double)CONCAT44(0x45300000,(int)(local_350 >> 0x20)) - 1.9342813113834067e+25;
  local_308 = dStack_300 + ((double)CONCAT44(0x43300000,(int)local_350) - 4503599627370496.0);
  local_320 = &this->exTypes;
  local_318 = local_338 + 1;
  local_37c = 0xffffffff;
  uVar4 = 0;
  local_348 = (byte *)0x0;
  uVar19 = 0;
  this_01 = local_388;
  do {
    local_398 = (ExternFuncInfo *)CONCAT44(local_398._4_4_,uVar4);
    if (((int)local_330 == 0) || ((this->exRegVmCode).count <= uVar4)) {
      if ((char)local_36c != '\0') {
        OutputContext::Printf(this_01,"\n");
        uVar14 = local_350;
        local_38c = (float)local_350;
        for (code_00 = rviNop; this_01 = local_388, code_00 != 0x100;
            code_00 = code_00 + rviLoadByte) {
          puVar7 = FixedArray<unsigned_int,_256U>::operator[]
                             (&this->exRegVmInstructionExecCount,code_00);
          uVar19 = *puVar7;
          if (uVar19 != 0) {
            pcVar12 = GetInstructionName(code_00);
            OutputContext::Printf
                      (local_388,"// %9s: %10d (%4.1f%%)\n",
                       (double)((float)uVar19 / local_38c) * 100.0,pcVar12,(ulong)uVar19);
          }
        }
        OutputContext::Printf
                  (local_388,"// %9s: %10lld (%4.0f%%)\n",0x4059000000000000,"total",uVar14);
      }
      OutputContext::Flush(this_01);
      SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::
      ~SmallDenseMap(&regVmFunctionMap);
      SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::~SmallDenseSet
                (&regVmJumpTargetSet);
      NULLC::TraceScope::~TraceScope(&traceScope);
      return true;
    }
    uVar13 = uVar18;
    if (uVar18 < uVar19) {
      uVar13 = uVar19;
    }
    uVar14 = (ulong)uVar19;
    pEVar16 = local_318 + uVar14;
    uVar5 = uVar19 - 1;
    do {
      uVar19 = uVar13;
      if (uVar18 <= uVar14) break;
      uVar14 = uVar14 + 1;
      uVar19 = uVar5 + 1;
      puVar7 = &pEVar16->instruction;
      pEVar16 = pEVar16 + 1;
      uVar5 = uVar19;
    } while (*puVar7 <= uVar4);
    uVar4 = local_37c;
    if (uVar19 != local_37c) {
      pbVar15 = (byte *)(this->exSource).data;
      uVar14 = (ulong)local_338[uVar19].sourceOffset;
      do {
        uVar9 = uVar14;
        if (uVar9 == 0) goto LAB_0026d044;
        uVar14 = uVar9 - 1;
      } while (pbVar15[uVar9 - 1] != 10);
      pbVar15 = pbVar15 + uVar9;
LAB_0026d044:
      uVar13 = (int)pbVar15 - (int)pbVar17;
      for (; (bVar1 = *pbVar15, bVar1 == 9 || (bVar1 == 0x20)); pbVar15 = pbVar15 + 1) {
        uVar13 = uVar13 + 1;
      }
      uVar5 = 0;
      pbVar20 = pbVar15;
      while ((0xd < bVar1 || ((0x2401U >> (bVar1 & 0x1f) & 1) == 0))) {
        bVar1 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
        uVar5 = uVar5 + 1;
        uVar13 = uVar13 + 1;
      }
      uVar4 = uVar19;
      if (pbVar17 < pbVar20) {
        OutputContext::Printf(local_388,"%.*s\r\n",(ulong)uVar13,pbVar17);
        pbVar17 = pbVar20;
      }
      else if (pbVar15 != local_348) {
        OutputContext::Printf(local_388,"%.*s\r\n",(ulong)uVar5,pbVar15);
        local_348 = pbVar15;
      }
    }
    local_37c = uVar4;
    pRVar10 = FastVector<RegVmCmd,_false,_false>::operator[](local_360,(uint)local_398);
    local_38c = (float)(uint)pRVar10->code;
    rA = pRVar10->rA;
    rB = pRVar10->rB;
    rC = pRVar10->rC;
    local_310 = (ulong)pRVar10->argument;
    bVar3 = SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::contains
                      (&regVmJumpTargetSet,(uint *)&local_398);
    ppEVar11 = SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::find
                         (&regVmFunctionMap,(uint *)&local_398);
    if (ppEVar11 != (ExternFuncInfo **)0x0) {
      OutputContext::Printf
                (local_388,"// %s#%d\n",(this->exSymbols).data + (*ppEVar11)->offsetToName,
                 ((long)*ppEVar11 - (long)(this->exFunctions).data) / 0x94 & 0xffffffff);
    }
    pFVar2 = local_340;
    this_01 = local_388;
    code = local_38c;
    if ((char)local_36c == '\0') {
      if (bVar3) {
        OutputContext::Printf(local_388,"// %4d:\n");
        OutputContext::Printf(this_01,"//      ");
      }
      else {
        OutputContext::Printf(local_388,"// %4d ");
      }
    }
    else if (bVar3) {
      OutputContext::Printf(local_388,"//            %4d:\n");
      pFVar2 = local_340;
      puVar7 = FastVector<unsigned_int,_false,_false>::operator[](local_340,(uint)local_398);
      local_368 = ((double)*puVar7 / local_308) * 100.0;
      puVar7 = FastVector<unsigned_int,_false,_false>::operator[](pFVar2,(uint)local_398);
      if (local_368 <= 0.1) {
        OutputContext::Printf(this_01,"// (%8d     )      ",(ulong)*puVar7);
        this = local_378;
      }
      else {
        OutputContext::Printf(this_01,"// (%8d %4.1f)      ",(ulong)*puVar7);
        this = local_378;
      }
    }
    else {
      puVar7 = FastVector<unsigned_int,_false,_false>::operator[](local_340,(uint)local_398);
      local_368 = ((double)*puVar7 / local_308) * 100.0;
      puVar7 = FastVector<unsigned_int,_false,_false>::operator[](pFVar2,(uint)local_398);
      this_01 = local_388;
      if (local_368 <= 0.1) {
        OutputContext::Printf
                  (local_388,"// (%8d     ) %4d ",(ulong)*puVar7,(ulong)local_398 & 0xffffffff);
        this = local_378;
      }
      else {
        OutputContext::Printf
                  (local_388,"// (%8d %4.1f) %4d ",(ulong)*puVar7,(ulong)local_398 & 0xffffffff);
        this = local_378;
      }
    }
    PrintInstruction(this_01,(char *)(this->exRegVmConstants).data,(this->exFunctions).data,
                     (this->exSymbols).data,(RegVmInstructionCode)code,rA,rB,rC,(uint)local_310,
                     (VmConstant *)0x0);
    if (code == 1.33123e-43) {
LAB_0026d355:
      pcVar12 = (this->exSymbols).data;
      pRVar10 = FastVector<RegVmCmd,_false,_false>::operator[](local_360,(uint)local_398);
      pEVar8 = FastVector<ExternFuncInfo,_false,_false>::operator[](local_328,pRVar10->argument);
LAB_0026d3a1:
      OutputContext::Printf(this_01," (%s)",pcVar12 + pEVar8->offsetToName);
    }
    else {
      if (code == 1.31722e-43) {
        pcVar12 = (this->exSymbols).data;
        pRVar10 = FastVector<RegVmCmd,_false,_false>::operator[](local_360,(uint)local_398);
        pEVar8 = (ExternFuncInfo *)
                 FastVector<ExternTypeInfo,_false,_false>::operator[](local_320,pRVar10->argument);
        goto LAB_0026d3a1;
      }
      if (code == 4.48416e-44) goto LAB_0026d355;
    }
    OutputContext::Printf(this_01,"\n");
    uVar4 = (uint)local_398 + 1;
  } while( true );
}

Assistant:

bool Linker::SaveRegVmListing(OutputContext &output, bool withProfileInfo)
{
	TRACE_SCOPE("link", "SaveRegVmListing");

	unsigned line = 0, lastLine = ~0u;

	unsigned long long total = 0;

	if(withProfileInfo)
	{
		for(unsigned i = 0; i < 256; i++)
			total += exRegVmInstructionExecCount[i];
	}

	ExternSourceInfo *info = (ExternSourceInfo*)exRegVmSourceInfo.data;
	unsigned infoSize = exRegVmSourceInfo.size();

	SmallDenseSet<unsigned, SmallDenseMapUnsignedHasher, 32> regVmJumpTargetSet;

	for(unsigned i = 0; i < regVmJumpTargets.size(); i++)
		regVmJumpTargetSet.insert(regVmJumpTargets[i]);

	SmallDenseMap<unsigned, ExternFuncInfo*, SmallDenseMapUnsignedHasher, 32> regVmFunctionMap;

	for(unsigned i = 0; i < exFunctions.size(); i++)
		regVmFunctionMap.insert(exFunctions[i].regVmAddress, &exFunctions[i]);

	const char *lastSourcePos = exSource.data;
	const char *lastCodeStart = NULL;

	for(unsigned i = 0; infoSize && i < exRegVmCode.size(); i++)
	{
		while((line < infoSize - 1) && (i >= info[line + 1].instruction))
			line++;

		if(line != lastLine)
		{
			lastLine = line;

			const char *codeStart = exSource.data + info[line].sourceOffset;

			// Find beginning of the line
			while(codeStart != exSource.data && *(codeStart-1) != '\n')
				codeStart--;

			// Skip whitespace
			while(*codeStart == ' ' || *codeStart == '\t')
				codeStart++;

			const char *codeEnd = codeStart;
			while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
				codeEnd++;

			if(codeEnd > lastSourcePos)
			{
				output.Printf("%.*s\r\n", int(codeEnd - lastSourcePos), lastSourcePos);
				lastSourcePos = codeEnd;
			}
			else
			{
				if(codeStart != lastCodeStart)
					output.Printf("%.*s\r\n", int(codeEnd - codeStart), codeStart);

				lastCodeStart = codeStart;
			}
		}

		RegVmCmd cmd = exRegVmCode[i];

		bool found = regVmJumpTargetSet.contains(i);

		if(ExternFuncInfo **func = regVmFunctionMap.find(i))
			output.Printf("// %s#%d\n", exSymbols.data + (*func)->offsetToName, unsigned(*func - exFunctions.data));

		if(withProfileInfo)
		{
			if(found)
			{
				output.Printf("//            %4d:\n", i);

				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f)      ", exRegVmExecCount[i], percent);
				else
					output.Printf("// (%8d     )      ", exRegVmExecCount[i]);
			}
			else
			{
				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f) %4d ", exRegVmExecCount[i], percent, i);
				else
					output.Printf("// (%8d     ) %4d ", exRegVmExecCount[i], i);
			}
		}
		else
		{
			if(found)
			{
				output.Printf("// %4d:\n", i);
				output.Printf("//      ");
			}
			else
			{
				output.Printf("// %4d ", i);
			}
		}

		PrintInstruction(output, (char*)exRegVmConstants.data, exFunctions.data, exSymbols.data, RegVmInstructionCode(cmd.code), cmd.rA, cmd.rB, cmd.rC, cmd.argument, NULL);

		if(cmd.code == rviCall || cmd.code == rviFuncAddr)
			output.Printf(" (%s)", exSymbols.data + exFunctions[exRegVmCode[i].argument].offsetToName);
		else if(cmd.code == rviConvertPtr)
			output.Printf(" (%s)", exSymbols.data + exTypes[exRegVmCode[i].argument].offsetToName);

		output.Printf("\n");
	}

	if(withProfileInfo)
	{
		output.Printf("\n");

		for(unsigned i = 0; i < 256; i++)
		{
			if(unsigned count = exRegVmInstructionExecCount[i])
				output.Printf("// %9s: %10d (%4.1f%%)\n", GetInstructionName(RegVmInstructionCode(i)), count, float(count) / total * 100.0);
		}

		output.Printf("// %9s: %10lld (%4.0f%%)\n", "total", total, 100.0);
	}

	output.Flush();

	return true;
}